

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O0

psa_status_t
psa_rsa_sign(mbedtls_rsa_context *rsa,psa_algorithm_t alg,uint8_t *hash,size_t hash_length,
            uint8_t *signature,size_t signature_size,size_t *signature_length)

{
  ulong uVar1;
  size_t sVar2;
  mbedtls_md_type_t local_4c;
  int local_48;
  mbedtls_md_type_t md_alg;
  int ret;
  psa_status_t status;
  size_t signature_size_local;
  uint8_t *signature_local;
  size_t hash_length_local;
  uint8_t *hash_local;
  mbedtls_rsa_context *pmStack_18;
  psa_algorithm_t alg_local;
  mbedtls_rsa_context *rsa_local;
  
  local_48 = 0xffffff92;
  _ret = signature_size;
  signature_size_local = (size_t)signature;
  signature_local = (uint8_t *)hash_length;
  hash_length_local = (size_t)hash;
  hash_local._4_4_ = alg;
  pmStack_18 = rsa;
  md_alg = psa_rsa_decode_md_type(alg,hash_length,&local_4c);
  uVar1 = _ret;
  rsa_local._4_4_ = md_alg;
  if (md_alg == MBEDTLS_MD_NONE) {
    sVar2 = mbedtls_rsa_get_len(pmStack_18);
    if (uVar1 < sVar2) {
      rsa_local._4_4_ = 0xffffff76;
    }
    else {
      if ((hash_local._4_4_ & 0xffffff00) == 0x10020000) {
        mbedtls_rsa_set_padding(pmStack_18,0,0);
        local_48 = mbedtls_rsa_pkcs1_sign
                             (pmStack_18,mbedtls_ctr_drbg_random,&global_data.ctr_drbg,1,local_4c,
                              (uint)signature_local,(uchar *)hash_length_local,
                              (uchar *)signature_size_local);
      }
      else {
        if ((hash_local._4_4_ & 0xffffff00) != 0x10030000) {
          return -0x87;
        }
        mbedtls_rsa_set_padding(pmStack_18,1,local_4c);
        local_48 = mbedtls_rsa_rsassa_pss_sign
                             (pmStack_18,mbedtls_ctr_drbg_random,&global_data.ctr_drbg,1,
                              MBEDTLS_MD_NONE,(uint)signature_local,(uchar *)hash_length_local,
                              (uchar *)signature_size_local);
      }
      if (local_48 == 0) {
        sVar2 = mbedtls_rsa_get_len(pmStack_18);
        *signature_length = sVar2;
      }
      rsa_local._4_4_ = mbedtls_to_psa_error(local_48);
    }
  }
  return rsa_local._4_4_;
}

Assistant:

static psa_status_t psa_rsa_sign( mbedtls_rsa_context *rsa,
                                  psa_algorithm_t alg,
                                  const uint8_t *hash,
                                  size_t hash_length,
                                  uint8_t *signature,
                                  size_t signature_size,
                                  size_t *signature_length )
{
    psa_status_t status;
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_md_type_t md_alg;

    status = psa_rsa_decode_md_type( alg, hash_length, &md_alg );
    if( status != PSA_SUCCESS )
        return( status );

    if( signature_size < mbedtls_rsa_get_len( rsa ) )
        return( PSA_ERROR_BUFFER_TOO_SMALL );

#if defined(MBEDTLS_PKCS1_V15)
    if( PSA_ALG_IS_RSA_PKCS1V15_SIGN( alg ) )
    {
        mbedtls_rsa_set_padding( rsa, MBEDTLS_RSA_PKCS_V15,
                                 MBEDTLS_MD_NONE );
        ret = mbedtls_rsa_pkcs1_sign( rsa,
                                      mbedtls_ctr_drbg_random,
                                      &global_data.ctr_drbg,
                                      MBEDTLS_RSA_PRIVATE,
                                      md_alg,
                                      (unsigned int) hash_length,
                                      hash,
                                      signature );
    }
    else
#endif /* MBEDTLS_PKCS1_V15 */
#if defined(MBEDTLS_PKCS1_V21)
    if( PSA_ALG_IS_RSA_PSS( alg ) )
    {
        mbedtls_rsa_set_padding( rsa, MBEDTLS_RSA_PKCS_V21, md_alg );
        ret = mbedtls_rsa_rsassa_pss_sign( rsa,
                                           mbedtls_ctr_drbg_random,
                                           &global_data.ctr_drbg,
                                           MBEDTLS_RSA_PRIVATE,
                                           MBEDTLS_MD_NONE,
                                           (unsigned int) hash_length,
                                           hash,
                                           signature );
    }
    else
#endif /* MBEDTLS_PKCS1_V21 */
    {
        return( PSA_ERROR_INVALID_ARGUMENT );
    }

    if( ret == 0 )
        *signature_length = mbedtls_rsa_get_len( rsa );
    return( mbedtls_to_psa_error( ret ) );
}